

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

Simplex_handle __thiscall
Gudhi::Simplex_tree<Low_options>::find<std::initializer_list<unsigned_char>>
          (Simplex_tree<Low_options> *this,initializer_list<unsigned_char> *s)

{
  uchar *__first;
  uchar *__last;
  iterator __first_00;
  iterator __last_00;
  initializer_list<unsigned_char> *in_RDX;
  allocator<unsigned_char> local_69;
  undefined1 local_68 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> copy;
  uchar *last;
  uchar *first;
  initializer_list<unsigned_char> *s_local;
  Simplex_tree<Low_options> *this_local;
  
  __first = std::begin<unsigned_char>(*in_RDX);
  copy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_RDX->_M_array;
  __last = std::end<unsigned_char>(*in_RDX);
  if (__first == __last) {
    null_simplex();
  }
  else {
    std::allocator<unsigned_char>::allocator(&local_69);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_68,__first,__last,
               &local_69);
    std::allocator<unsigned_char>::~allocator(&local_69);
    __first_00 = std::begin<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
    __last_00 = std::end<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__first_00._M_current,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__last_00._M_current);
    find_simplex(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)s);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
  }
  return (Simplex_handle)
         (pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>
          *)this;
}

Assistant:

Simplex_handle find(const InputVertexRange & s) const {
    auto first = std::begin(s);
    auto last = std::end(s);

    if (first == last)
      return null_simplex();  // ----->>

    // Copy before sorting
    std::vector<Vertex_handle> copy(first, last);
    std::sort(std::begin(copy), std::end(copy));
    return find_simplex(copy);
  }